

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_top_n_sigma_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_token_data *plVar1;
  ulong uVar2;
  size_t sVar3;
  float *pfVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  plVar1 = cur_p->data;
  uVar2 = cur_p->size;
  fVar10 = plVar1->logit;
  if (uVar2 == 0) {
    fVar8 = 0.0;
    fVar6 = 0.0;
  }
  else {
    pfVar4 = &plVar1->logit;
    fVar7 = 0.0;
    uVar5 = uVar2;
    fVar6 = fVar10;
    do {
      fVar10 = *pfVar4;
      fVar7 = fVar7 + fVar10;
      if (fVar10 <= fVar6) {
        fVar10 = fVar6;
      }
      pfVar4 = pfVar4 + 3;
      uVar5 = uVar5 - 1;
      fVar6 = fVar10;
    } while (uVar5 != 0);
    fVar8 = (float)uVar2;
    pfVar4 = &plVar1->logit;
    fVar6 = 0.0;
    do {
      fVar9 = *pfVar4 - fVar7 / fVar8;
      fVar6 = fVar6 + fVar9 * fVar9;
      pfVar4 = pfVar4 + 3;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  fVar6 = fVar6 / fVar8;
  pfVar4 = (float *)smpl->ctx;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  sVar3 = cur_p->size;
  if (sVar3 != 0) {
    fVar10 = fVar10 - fVar6 * *pfVar4;
    pfVar4 = &cur_p->data->logit;
    do {
      if (*pfVar4 <= fVar10 && fVar10 != *pfVar4) {
        *pfVar4 = -INFINITY;
      }
      pfVar4 = pfVar4 + 3;
      sVar3 = sVar3 - 1;
    } while (sVar3 != 0);
  }
  llama_sampler_softmax_impl(cur_p);
  return;
}

Assistant:

static void llama_sampler_top_n_sigma_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    const auto * ctx = (llama_sampler_top_n_sigma *) smpl->ctx;

    // find max logit and calculate mean
    float max = cur_p->data[0].logit;
    float logits_sum = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit > max) {
            max = cur_p->data[i].logit;
        }
        logits_sum += cur_p->data[i].logit;
    }
    float mean = logits_sum/cur_p->size;

    // calculate standard deviation
    float acc = 0;
    for (size_t i = 0; i < cur_p->size; ++i) {
        acc += pow(cur_p->data[i].logit - mean, 2);
    }
    float std = sqrt(acc/cur_p->size);

    //apply mask
    for (size_t i = 0; i < cur_p->size; ++i) {
        if (cur_p->data[i].logit < max - (ctx->n * std)) {
            cur_p->data[i].logit = -INFINITY;
        }
    }
    llama_sampler_softmax_impl(cur_p);
}